

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

int EVP_EncodeBlock(uchar *t,uchar *f,int n)

{
  byte bVar1;
  byte a;
  long lVar2;
  uint8_t uVar3;
  undefined4 in_register_00000014;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (CONCAT44(in_register_00000014,n) == 0) {
    lVar6 = 0;
  }
  else {
    uVar7 = CONCAT44(in_register_00000014,n);
    pbVar4 = f + 1;
    lVar2 = 4;
    do {
      lVar6 = lVar2;
      uVar5 = (uint)pbVar4[-1] << 0x10;
      if (uVar7 < 3) {
        if (uVar7 == 2) {
          uVar5 = uVar5 | (uint)*pbVar4 << 8;
        }
        uVar3 = conv_bin2ascii((uint8_t)(uVar5 >> 0x12));
        t[lVar6 + -4] = uVar3;
        uVar3 = conv_bin2ascii((uint8_t)(uVar5 >> 0xc));
        t[lVar6 + -3] = uVar3;
        uVar3 = '=';
        if (uVar7 != 1) {
          uVar3 = conv_bin2ascii((uint8_t)(uVar5 >> 6));
        }
        t[lVar6 + -2] = uVar3;
        t[lVar6 + -1] = '=';
        t = t + lVar6;
        goto LAB_004bae26;
      }
      bVar1 = *pbVar4;
      a = pbVar4[1];
      uVar3 = conv_bin2ascii(pbVar4[-1] >> 2);
      t[lVar6 + -4] = uVar3;
      uVar3 = conv_bin2ascii((uint8_t)(((uint)bVar1 * 0x100 | uVar5) >> 0xc));
      t[lVar6 + -3] = uVar3;
      uVar3 = conv_bin2ascii((uint8_t)((uint)a + (uint)bVar1 * 0x100 >> 6));
      t[lVar6 + -2] = uVar3;
      uVar3 = conv_bin2ascii(a);
      t[lVar6 + -1] = uVar3;
      pbVar4 = pbVar4 + 3;
      uVar7 = uVar7 - 3;
      lVar2 = lVar6 + 4;
    } while (uVar7 != 0);
    t = t + lVar6;
  }
LAB_004bae26:
  *t = '\0';
  return (int)lVar6;
}

Assistant:

size_t EVP_EncodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  uint32_t l;
  size_t remaining = src_len, ret = 0;

  while (remaining) {
    if (remaining >= 3) {
      l = (((uint32_t)src[0]) << 16L) | (((uint32_t)src[1]) << 8L) | src[2];
      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = conv_bin2ascii(l >> 6L);
      *(dst++) = conv_bin2ascii(l);
      remaining -= 3;
    } else {
      l = ((uint32_t)src[0]) << 16L;
      if (remaining == 2) {
        l |= ((uint32_t)src[1] << 8L);
      }

      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = (remaining == 1) ? '=' : conv_bin2ascii(l >> 6L);
      *(dst++) = '=';
      remaining = 0;
    }
    ret += 4;
    src += 3;
  }

  *dst = '\0';
  return ret;
}